

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

string * __thiscall adios2::IO::Name_abi_cxx11_(string *__return_storage_ptr__,IO *this)

{
  IO *pIVar1;
  long lVar2;
  string local_48;
  
  pIVar1 = this->m_IO;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to IO::InConfigFile","");
  helper::CheckForNullptr<adios2::core::IO>(pIVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pIVar1 = this->m_IO;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)(pIVar1 + 0x18);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,*(long *)(pIVar1 + 0x20) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string IO::Name() const
{
    helper::CheckForNullptr(m_IO, "in call to IO::InConfigFile");
    return m_IO->m_Name;
}